

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# btStridingMeshInterface.cpp
# Opt level: O3

void __thiscall
btStridingMeshInterface::InternalProcessAllTriangles
          (btStridingMeshInterface *this,btInternalTriangleIndexCallback *callback,
          btVector3 *aabbMin,btVector3 *aabbMax)

{
  long lVar1;
  long lVar2;
  uint uVar3;
  ulong uVar4;
  ulong uVar5;
  btScalar bVar6;
  int numtriangles;
  int stride;
  int indexstride;
  undefined8 local_98;
  float local_90;
  undefined4 local_8c;
  undefined8 local_88;
  float local_80;
  undefined4 local_7c;
  undefined8 local_78;
  float local_70;
  undefined4 local_6c;
  uchar *indexbase;
  uchar *vertexbase;
  undefined8 local_58;
  undefined8 uStack_50;
  PHY_ScalarType gfxindextype;
  uint local_3c;
  PHY_ScalarType type;
  int numverts;
  
  local_3c = (*this->_vptr_btStridingMeshInterface[7])();
  if (0 < (int)local_3c) {
    local_58 = *(undefined8 *)(this->m_scaling).m_floats;
    uStack_50 = 0;
    bVar6 = (this->m_scaling).m_floats[2];
    uVar5 = 0;
    do {
      (*this->_vptr_btStridingMeshInterface[4])
                (this,&vertexbase,&numverts,&type,&stride,&indexbase,&indexstride,&numtriangles,
                 &gfxindextype,uVar5,bVar6);
      if (type == PHY_DOUBLE) {
        if (gfxindextype == PHY_INTEGER) {
          if (0 < numtriangles) {
            uVar4 = 0;
            do {
              lVar1 = (long)indexstride * (long)(int)uVar4;
              local_90 = (float)*(double *)
                                 (vertexbase +
                                 (ulong)(uint)(*(int *)(indexbase + lVar1) * stride) + 0x10) * bVar6
              ;
              local_98 = CONCAT44((float)*(double *)
                                          ((long)(vertexbase +
                                                 (uint)(*(int *)(indexbase + lVar1) * stride)) + 8)
                                  * local_58._4_4_,
                                  (float)*(double *)
                                          (vertexbase + (uint)(*(int *)(indexbase + lVar1) * stride)
                                          ) * (float)local_58);
              local_8c = 0;
              local_80 = (float)*(double *)
                                 (vertexbase +
                                 (ulong)(uint)(*(int *)(indexbase + lVar1 + 4) * stride) + 0x10) *
                         bVar6;
              local_88 = CONCAT44((float)*(double *)
                                          ((long)(vertexbase +
                                                 (uint)(*(int *)(indexbase + lVar1 + 4) * stride)) +
                                          8) * local_58._4_4_,
                                  (float)*(double *)
                                          (vertexbase +
                                          (uint)(*(int *)(indexbase + lVar1 + 4) * stride)) *
                                  (float)local_58);
              local_7c = 0;
              local_70 = (float)*(double *)
                                 (vertexbase +
                                 (ulong)(uint)(stride * *(int *)(indexbase + lVar1 + 8)) + 0x10) *
                         bVar6;
              local_78 = CONCAT44((float)*(double *)
                                          ((long)(vertexbase +
                                                 (uint)(stride * *(int *)(indexbase + lVar1 + 8))) +
                                          8) * local_58._4_4_,
                                  (float)*(double *)
                                          (vertexbase +
                                          (uint)(stride * *(int *)(indexbase + lVar1 + 8))) *
                                  (float)local_58);
              local_6c = 0;
              (*callback->_vptr_btInternalTriangleIndexCallback[2])(callback,&local_98,uVar5,uVar4);
              uVar3 = (int)uVar4 + 1;
              uVar4 = (ulong)uVar3;
            } while ((int)uVar3 < numtriangles);
          }
        }
        else if (gfxindextype == PHY_SHORT) {
          if (0 < numtriangles) {
            uVar4 = 0;
            do {
              lVar1 = (long)indexstride * (long)(int)uVar4;
              lVar2 = (long)stride;
              local_90 = (float)*(double *)
                                 (vertexbase + (ulong)*(ushort *)(indexbase + lVar1) * lVar2 + 0x10)
                         * bVar6;
              local_98 = CONCAT44((float)*(double *)
                                          ((long)(vertexbase +
                                                 (ulong)*(ushort *)(indexbase + lVar1) * lVar2) + 8)
                                  * local_58._4_4_,
                                  (float)*(double *)
                                          (vertexbase +
                                          (ulong)*(ushort *)(indexbase + lVar1) * lVar2) *
                                  (float)local_58);
              local_8c = 0;
              local_80 = (float)*(double *)
                                 (vertexbase +
                                 (ulong)*(ushort *)(indexbase + lVar1 + 2) * lVar2 + 0x10) * bVar6;
              local_88 = CONCAT44((float)*(double *)
                                          ((long)(vertexbase +
                                                 (ulong)*(ushort *)(indexbase + lVar1 + 2) * lVar2)
                                          + 8) * local_58._4_4_,
                                  (float)*(double *)
                                          (vertexbase +
                                          (ulong)*(ushort *)(indexbase + lVar1 + 2) * lVar2) *
                                  (float)local_58);
              local_7c = 0;
              local_70 = (float)*(double *)
                                 (vertexbase +
                                 (ulong)*(ushort *)(indexbase + lVar1 + 4) * lVar2 + 0x10) * bVar6;
              local_78 = CONCAT44((float)*(double *)
                                          ((long)(vertexbase +
                                                 (ulong)*(ushort *)(indexbase + lVar1 + 4) * lVar2)
                                          + 8) * local_58._4_4_,
                                  (float)*(double *)
                                          (vertexbase +
                                          (ulong)*(ushort *)(indexbase + lVar1 + 4) * lVar2) *
                                  (float)local_58);
              local_6c = 0;
              (*callback->_vptr_btInternalTriangleIndexCallback[2])(callback,&local_98,uVar5,uVar4);
              uVar3 = (int)uVar4 + 1;
              uVar4 = (ulong)uVar3;
            } while ((int)uVar3 < numtriangles);
          }
        }
        else if ((gfxindextype == PHY_UCHAR) && (0 < numtriangles)) {
          uVar4 = 0;
          do {
            lVar1 = (long)indexstride * (long)(int)uVar4;
            lVar2 = (long)stride;
            local_90 = (float)*(double *)(vertexbase + (ulong)indexbase[lVar1] * lVar2 + 0x10) *
                       bVar6;
            local_98 = CONCAT44((float)*(double *)
                                        ((long)(vertexbase + (ulong)indexbase[lVar1] * lVar2) + 8) *
                                local_58._4_4_,
                                (float)*(double *)(vertexbase + (ulong)indexbase[lVar1] * lVar2) *
                                (float)local_58);
            local_8c = 0;
            local_80 = (float)*(double *)(vertexbase + (ulong)indexbase[lVar1 + 1] * lVar2 + 0x10) *
                       bVar6;
            local_88 = CONCAT44((float)*(double *)
                                        ((long)(vertexbase + (ulong)indexbase[lVar1 + 1] * lVar2) +
                                        8) * local_58._4_4_,
                                (float)*(double *)(vertexbase + (ulong)indexbase[lVar1 + 1] * lVar2)
                                * (float)local_58);
            local_7c = 0;
            local_70 = (float)*(double *)(vertexbase + (ulong)indexbase[lVar1 + 2] * lVar2 + 0x10) *
                       bVar6;
            local_78 = CONCAT44((float)*(double *)
                                        ((long)(vertexbase + (ulong)indexbase[lVar1 + 2] * lVar2) +
                                        8) * local_58._4_4_,
                                (float)*(double *)(vertexbase + (ulong)indexbase[lVar1 + 2] * lVar2)
                                * (float)local_58);
            local_6c = 0;
            (*callback->_vptr_btInternalTriangleIndexCallback[2])(callback,&local_98,uVar5,uVar4);
            uVar3 = (int)uVar4 + 1;
            uVar4 = (ulong)uVar3;
          } while ((int)uVar3 < numtriangles);
        }
      }
      else if (type == PHY_FLOAT) {
        if (gfxindextype == PHY_INTEGER) {
          if (0 < numtriangles) {
            uVar4 = 0;
            do {
              lVar1 = (long)indexstride * (long)(int)uVar4;
              local_90 = *(float *)(vertexbase +
                                   (ulong)(uint)(*(int *)(indexbase + lVar1) * stride) + 8) * bVar6;
              local_98 = CONCAT44((float)((ulong)*(undefined8 *)
                                                  (vertexbase +
                                                  (uint)(*(int *)(indexbase + lVar1) * stride)) >>
                                         0x20) * local_58._4_4_,
                                  (float)*(undefined8 *)
                                          (vertexbase + (uint)(*(int *)(indexbase + lVar1) * stride)
                                          ) * (float)local_58);
              local_8c = 0;
              local_80 = *(float *)(vertexbase +
                                   (ulong)(uint)(*(int *)(indexbase + lVar1 + 4) * stride) + 8) *
                         bVar6;
              local_88 = CONCAT44((float)((ulong)*(undefined8 *)
                                                  (vertexbase +
                                                  (uint)(*(int *)(indexbase + lVar1 + 4) * stride))
                                         >> 0x20) * local_58._4_4_,
                                  (float)*(undefined8 *)
                                          (vertexbase +
                                          (uint)(*(int *)(indexbase + lVar1 + 4) * stride)) *
                                  (float)local_58);
              local_7c = 0;
              local_70 = *(float *)(vertexbase +
                                   (ulong)(uint)(stride * *(int *)(indexbase + lVar1 + 8)) + 8) *
                         bVar6;
              local_78 = CONCAT44((float)((ulong)*(undefined8 *)
                                                  (vertexbase +
                                                  (uint)(stride * *(int *)(indexbase + lVar1 + 8)))
                                         >> 0x20) * local_58._4_4_,
                                  (float)*(undefined8 *)
                                          (vertexbase +
                                          (uint)(stride * *(int *)(indexbase + lVar1 + 8))) *
                                  (float)local_58);
              local_6c = 0;
              (*callback->_vptr_btInternalTriangleIndexCallback[2])(callback,&local_98,uVar5,uVar4);
              uVar3 = (int)uVar4 + 1;
              uVar4 = (ulong)uVar3;
            } while ((int)uVar3 < numtriangles);
          }
        }
        else if (gfxindextype == PHY_SHORT) {
          if (0 < numtriangles) {
            uVar4 = 0;
            do {
              lVar1 = (long)indexstride * (long)(int)uVar4;
              lVar2 = (long)stride;
              local_90 = *(float *)(vertexbase + (ulong)*(ushort *)(indexbase + lVar1) * lVar2 + 8)
                         * bVar6;
              local_98 = CONCAT44((float)((ulong)*(undefined8 *)
                                                  (vertexbase +
                                                  (ulong)*(ushort *)(indexbase + lVar1) * lVar2) >>
                                         0x20) * local_58._4_4_,
                                  (float)*(undefined8 *)
                                          (vertexbase +
                                          (ulong)*(ushort *)(indexbase + lVar1) * lVar2) *
                                  (float)local_58);
              local_8c = 0;
              local_80 = *(float *)(vertexbase +
                                   (ulong)*(ushort *)(indexbase + lVar1 + 2) * lVar2 + 8) * bVar6;
              local_88 = CONCAT44((float)((ulong)*(undefined8 *)
                                                  (vertexbase +
                                                  (ulong)*(ushort *)(indexbase + lVar1 + 2) * lVar2)
                                         >> 0x20) * local_58._4_4_,
                                  (float)*(undefined8 *)
                                          (vertexbase +
                                          (ulong)*(ushort *)(indexbase + lVar1 + 2) * lVar2) *
                                  (float)local_58);
              local_7c = 0;
              local_70 = *(float *)(vertexbase +
                                   (ulong)*(ushort *)(indexbase + lVar1 + 4) * lVar2 + 8) * bVar6;
              local_78 = CONCAT44((float)((ulong)*(undefined8 *)
                                                  (vertexbase +
                                                  (ulong)*(ushort *)(indexbase + lVar1 + 4) * lVar2)
                                         >> 0x20) * local_58._4_4_,
                                  (float)*(undefined8 *)
                                          (vertexbase +
                                          (ulong)*(ushort *)(indexbase + lVar1 + 4) * lVar2) *
                                  (float)local_58);
              local_6c = 0;
              (*callback->_vptr_btInternalTriangleIndexCallback[2])(callback,&local_98,uVar5,uVar4);
              uVar3 = (int)uVar4 + 1;
              uVar4 = (ulong)uVar3;
            } while ((int)uVar3 < numtriangles);
          }
        }
        else if ((gfxindextype == PHY_UCHAR) && (0 < numtriangles)) {
          uVar4 = 0;
          do {
            lVar1 = (long)indexstride * (long)(int)uVar4;
            lVar2 = (long)stride;
            local_90 = *(float *)(vertexbase + (ulong)indexbase[lVar1] * lVar2 + 8) * bVar6;
            local_98 = CONCAT44((float)((ulong)*(undefined8 *)
                                                (vertexbase + (ulong)indexbase[lVar1] * lVar2) >>
                                       0x20) * local_58._4_4_,
                                (float)*(undefined8 *)(vertexbase + (ulong)indexbase[lVar1] * lVar2)
                                * (float)local_58);
            local_8c = 0;
            local_80 = *(float *)(vertexbase + (ulong)indexbase[lVar1 + 1] * lVar2 + 8) * bVar6;
            local_88 = CONCAT44((float)((ulong)*(undefined8 *)
                                                (vertexbase + (ulong)indexbase[lVar1 + 1] * lVar2)
                                       >> 0x20) * local_58._4_4_,
                                (float)*(undefined8 *)
                                        (vertexbase + (ulong)indexbase[lVar1 + 1] * lVar2) *
                                (float)local_58);
            local_7c = 0;
            local_70 = *(float *)(vertexbase + (ulong)indexbase[lVar1 + 2] * lVar2 + 8) * bVar6;
            local_78 = CONCAT44((float)((ulong)*(undefined8 *)
                                                (vertexbase + (ulong)indexbase[lVar1 + 2] * lVar2)
                                       >> 0x20) * local_58._4_4_,
                                (float)*(undefined8 *)
                                        (vertexbase + (ulong)indexbase[lVar1 + 2] * lVar2) *
                                (float)local_58);
            local_6c = 0;
            (*callback->_vptr_btInternalTriangleIndexCallback[2])(callback,&local_98,uVar5,uVar4);
            uVar3 = (int)uVar4 + 1;
            uVar4 = (ulong)uVar3;
          } while ((int)uVar3 < numtriangles);
        }
      }
      (*this->_vptr_btStridingMeshInterface[6])(this,uVar5);
      uVar3 = (int)uVar5 + 1;
      uVar5 = (ulong)uVar3;
    } while (uVar3 != local_3c);
  }
  return;
}

Assistant:

void	btStridingMeshInterface::InternalProcessAllTriangles(btInternalTriangleIndexCallback* callback,const btVector3& aabbMin,const btVector3& aabbMax) const
{
	(void)aabbMin;
	(void)aabbMax;
	int numtotalphysicsverts = 0;
	int part,graphicssubparts = getNumSubParts();
	const unsigned char * vertexbase;
	const unsigned char * indexbase;
	int indexstride;
	PHY_ScalarType type;
	PHY_ScalarType gfxindextype;
	int stride,numverts,numtriangles;
	int gfxindex;
	btVector3 triangle[3];

	btVector3 meshScaling = getScaling();

	///if the number of parts is big, the performance might drop due to the innerloop switch on indextype
	for (part=0;part<graphicssubparts ;part++)
	{
		getLockedReadOnlyVertexIndexBase(&vertexbase,numverts,type,stride,&indexbase,indexstride,numtriangles,gfxindextype,part);
		numtotalphysicsverts+=numtriangles*3; //upper bound

		///unlike that developers want to pass in double-precision meshes in single-precision Bullet build
		///so disable this feature by default
		///see patch http://code.google.com/p/bullet/issues/detail?id=213

		switch (type)
		{
		case PHY_FLOAT:
		 {

			 float* graphicsbase;

			 switch (gfxindextype)
			 {
			 case PHY_INTEGER:
				 {
					 for (gfxindex=0;gfxindex<numtriangles;gfxindex++)
					 {
						 unsigned int* tri_indices= (unsigned int*)(indexbase+gfxindex*indexstride);
						 graphicsbase = (float*)(vertexbase+tri_indices[0]*stride);
						 triangle[0].setValue(graphicsbase[0]*meshScaling.getX(),graphicsbase[1]*meshScaling.getY(),graphicsbase[2]*meshScaling.getZ());
						 graphicsbase = (float*)(vertexbase+tri_indices[1]*stride);
						 triangle[1].setValue(graphicsbase[0]*meshScaling.getX(),graphicsbase[1]*meshScaling.getY(),	graphicsbase[2]*meshScaling.getZ());
						 graphicsbase = (float*)(vertexbase+tri_indices[2]*stride);
						 triangle[2].setValue(graphicsbase[0]*meshScaling.getX(),graphicsbase[1]*meshScaling.getY(),	graphicsbase[2]*meshScaling.getZ());
						 callback->internalProcessTriangleIndex(triangle,part,gfxindex);
					 }
					 break;
				 }
			 case PHY_SHORT:
				 {
					 for (gfxindex=0;gfxindex<numtriangles;gfxindex++)
					 {
						 unsigned short int* tri_indices= (unsigned short int*)(indexbase+gfxindex*indexstride);
						 graphicsbase = (float*)(vertexbase+tri_indices[0]*stride);
						 triangle[0].setValue(graphicsbase[0]*meshScaling.getX(),graphicsbase[1]*meshScaling.getY(),graphicsbase[2]*meshScaling.getZ());
						 graphicsbase = (float*)(vertexbase+tri_indices[1]*stride);
						 triangle[1].setValue(graphicsbase[0]*meshScaling.getX(),graphicsbase[1]*meshScaling.getY(),	graphicsbase[2]*meshScaling.getZ());
						 graphicsbase = (float*)(vertexbase+tri_indices[2]*stride);
						 triangle[2].setValue(graphicsbase[0]*meshScaling.getX(),graphicsbase[1]*meshScaling.getY(),	graphicsbase[2]*meshScaling.getZ());
						 callback->internalProcessTriangleIndex(triangle,part,gfxindex);
					 }
					 break;
				 }
			case PHY_UCHAR:
				 {
					 for (gfxindex=0;gfxindex<numtriangles;gfxindex++)
					 {
						 unsigned char* tri_indices= (unsigned char*)(indexbase+gfxindex*indexstride);
						 graphicsbase = (float*)(vertexbase+tri_indices[0]*stride);
						 triangle[0].setValue(graphicsbase[0]*meshScaling.getX(),graphicsbase[1]*meshScaling.getY(),graphicsbase[2]*meshScaling.getZ());
						 graphicsbase = (float*)(vertexbase+tri_indices[1]*stride);
						 triangle[1].setValue(graphicsbase[0]*meshScaling.getX(),graphicsbase[1]*meshScaling.getY(),	graphicsbase[2]*meshScaling.getZ());
						 graphicsbase = (float*)(vertexbase+tri_indices[2]*stride);
						 triangle[2].setValue(graphicsbase[0]*meshScaling.getX(),graphicsbase[1]*meshScaling.getY(),	graphicsbase[2]*meshScaling.getZ());
						 callback->internalProcessTriangleIndex(triangle,part,gfxindex);
					 }
					 break;
				 }
			 default:
				 btAssert((gfxindextype == PHY_INTEGER) || (gfxindextype == PHY_SHORT));
			 }
			 break;
		 }

		case PHY_DOUBLE:
			{
				double* graphicsbase;

				switch (gfxindextype)
				{
				case PHY_INTEGER:
					{
						for (gfxindex=0;gfxindex<numtriangles;gfxindex++)
						{
							unsigned int* tri_indices= (unsigned int*)(indexbase+gfxindex*indexstride);
							graphicsbase = (double*)(vertexbase+tri_indices[0]*stride);
							triangle[0].setValue((btScalar)graphicsbase[0]*meshScaling.getX(),(btScalar)graphicsbase[1]*meshScaling.getY(),(btScalar)graphicsbase[2]*meshScaling.getZ());
							graphicsbase = (double*)(vertexbase+tri_indices[1]*stride);
							triangle[1].setValue((btScalar)graphicsbase[0]*meshScaling.getX(),(btScalar)graphicsbase[1]*meshScaling.getY(),  (btScalar)graphicsbase[2]*meshScaling.getZ());
							graphicsbase = (double*)(vertexbase+tri_indices[2]*stride);
							triangle[2].setValue((btScalar)graphicsbase[0]*meshScaling.getX(),(btScalar)graphicsbase[1]*meshScaling.getY(),  (btScalar)graphicsbase[2]*meshScaling.getZ());
							callback->internalProcessTriangleIndex(triangle,part,gfxindex);
						}
						break;
					}
				case PHY_SHORT:
					{
						for (gfxindex=0;gfxindex<numtriangles;gfxindex++)
						{
							unsigned short int* tri_indices= (unsigned short int*)(indexbase+gfxindex*indexstride);
							graphicsbase = (double*)(vertexbase+tri_indices[0]*stride);
							triangle[0].setValue((btScalar)graphicsbase[0]*meshScaling.getX(),(btScalar)graphicsbase[1]*meshScaling.getY(),(btScalar)graphicsbase[2]*meshScaling.getZ());
							graphicsbase = (double*)(vertexbase+tri_indices[1]*stride);
							triangle[1].setValue((btScalar)graphicsbase[0]*meshScaling.getX(),(btScalar)graphicsbase[1]*meshScaling.getY(),  (btScalar)graphicsbase[2]*meshScaling.getZ());
							graphicsbase = (double*)(vertexbase+tri_indices[2]*stride);
							triangle[2].setValue((btScalar)graphicsbase[0]*meshScaling.getX(),(btScalar)graphicsbase[1]*meshScaling.getY(),  (btScalar)graphicsbase[2]*meshScaling.getZ());
							callback->internalProcessTriangleIndex(triangle,part,gfxindex);
						}
						break;
					}
				case PHY_UCHAR:
					{
						for (gfxindex=0;gfxindex<numtriangles;gfxindex++)
						{
							unsigned char* tri_indices= (unsigned char*)(indexbase+gfxindex*indexstride);
							graphicsbase = (double*)(vertexbase+tri_indices[0]*stride);
							triangle[0].setValue((btScalar)graphicsbase[0]*meshScaling.getX(),(btScalar)graphicsbase[1]*meshScaling.getY(),(btScalar)graphicsbase[2]*meshScaling.getZ());
							graphicsbase = (double*)(vertexbase+tri_indices[1]*stride);
							triangle[1].setValue((btScalar)graphicsbase[0]*meshScaling.getX(),(btScalar)graphicsbase[1]*meshScaling.getY(),  (btScalar)graphicsbase[2]*meshScaling.getZ());
							graphicsbase = (double*)(vertexbase+tri_indices[2]*stride);
							triangle[2].setValue((btScalar)graphicsbase[0]*meshScaling.getX(),(btScalar)graphicsbase[1]*meshScaling.getY(),  (btScalar)graphicsbase[2]*meshScaling.getZ());
							callback->internalProcessTriangleIndex(triangle,part,gfxindex);
						}
						break;
					}
				default:
					btAssert((gfxindextype == PHY_INTEGER) || (gfxindextype == PHY_SHORT));
				}
				break;
			}
		default:
			btAssert((type == PHY_FLOAT) || (type == PHY_DOUBLE));
		}

		unLockReadOnlyVertexBase(part);
	}
}